

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.hpp
# Opt level: O0

ParseFlagMap * csv::internals::make_parse_flags(ParseFlagMap *__return_storage_ptr__,char delimiter)

{
  char cVar1;
  int iVar2;
  reference pvVar3;
  int iStack_10;
  char ch;
  int arr_idx;
  int i;
  char delimiter_local;
  
  memset(__return_storage_ptr__,0,0x400);
  for (iStack_10 = -0x80; iStack_10 < 0x80; iStack_10 = iStack_10 + 1) {
    iVar2 = iStack_10 + 0x80;
    cVar1 = (char)iStack_10;
    if (cVar1 == delimiter) {
      pvVar3 = std::array<csv::internals::ParseFlags,_256UL>::operator[]
                         (__return_storage_ptr__,(long)iVar2);
      *pvVar3 = DELIMITER;
    }
    else if ((cVar1 == '\r') || (cVar1 == '\n')) {
      pvVar3 = std::array<csv::internals::ParseFlags,_256UL>::operator[]
                         (__return_storage_ptr__,(long)iVar2);
      *pvVar3 = NEWLINE;
    }
    else {
      pvVar3 = std::array<csv::internals::ParseFlags,_256UL>::operator[]
                         (__return_storage_ptr__,(long)iVar2);
      *pvVar3 = NOT_SPECIAL;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

HEDLEY_CONST CONSTEXPR_17 ParseFlagMap make_parse_flags(char delimiter) {
            std::array<ParseFlags, 256> ret = {};
            for (int i = -128; i < 128; i++) {
                const int arr_idx = i + 128;
                char ch = char(i);

                if (ch == delimiter)
                    ret[arr_idx] = ParseFlags::DELIMITER;
                else if (ch == '\r' || ch == '\n')
                    ret[arr_idx] = ParseFlags::NEWLINE;
                else
                    ret[arr_idx] = ParseFlags::NOT_SPECIAL;
            }

            return ret;
        }